

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::transcode_uastc_to_bc5
               (uastc_block *src_blk,void *pDst,bool high_quality,uint32_t chan0,uint32_t chan1)

{
  bool bVar1;
  unpacked_uastc_block *puVar2;
  long in_RSI;
  unpacked_uastc_block *in_RDI;
  bool unpack_srgb;
  color32 block_pixels [4] [4];
  void *pBC4_block1;
  void *pBC4_block0;
  uint32_t mode;
  unpacked_uastc_block unpacked_src_blk;
  undefined8 in_stack_fffffffffffffec8;
  uint32_t a;
  uint8_t *in_stack_fffffffffffffed0;
  unpacked_uastc_block *unpacked_blk;
  unpacked_uastc_block *local_128;
  unpacked_uastc_block local_118;
  int local_54;
  uint32_t in_stack_ffffffffffffffb4;
  uint8_t *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  a = (uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  unpacked_uastc_block::unpacked_uastc_block((unpacked_uastc_block *)0x1aff9b);
  bVar1 = unpack_uastc((uastc_block *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       in_RDI,SUB81((ulong)in_RSI >> 0x38,0),SUB81((ulong)in_RSI >> 0x30,0));
  if (bVar1) {
    local_118.m_astc.m_weights[0x31] = (undefined1)local_54;
    local_118.m_astc.m_weights[0x32] = local_54._1_1_;
    local_118.m_astc.m_weights[0x33] = local_54._2_1_;
    local_118.m_astc.m_weights[0x34] = local_54._3_1_;
    local_118.m_astc.m_weights._33_8_ = in_RSI + 8;
    if (local_54 == 8) {
      write_bc4_solid_block(in_stack_fffffffffffffed0,a);
      write_bc4_solid_block(in_stack_fffffffffffffed0,a);
      bVar1 = true;
    }
    else {
      unpacked_blk = (unpacked_uastc_block *)(local_118.m_astc.m_weights + 0x19);
      puVar2 = &local_118;
      do {
        local_128 = puVar2;
        color32::color32((color32 *)local_128);
        puVar2 = (unpacked_uastc_block *)&(local_128->m_astc).m_subsets;
      } while (puVar2 != unpacked_blk);
      bVar1 = unpack_uastc(unpacked_blk,(color32 *)local_128,false);
      if (bVar1) {
        encode_bc4(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
        encode_bc4(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool transcode_uastc_to_bc5(const uastc_block& src_blk, void* pDst, bool high_quality, uint32_t chan0, uint32_t chan1)
	{
		BASISU_NOTE_UNUSED(high_quality);

		unpacked_uastc_block unpacked_src_blk;
		if (!unpack_uastc(src_blk, unpacked_src_blk, false))
			return false;

		const uint32_t mode = unpacked_src_blk.m_mode;

		void* pBC4_block0 = pDst;
		void* pBC4_block1 = (uint8_t*)pDst + 8;

		if (mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			write_bc4_solid_block(static_cast<uint8_t*>(pBC4_block0), unpacked_src_blk.m_solid_color.c[chan0]);
			write_bc4_solid_block(static_cast<uint8_t*>(pBC4_block1), unpacked_src_blk.m_solid_color.c[chan1]);
			return true;
		}

		color32 block_pixels[4][4];
		const bool unpack_srgb = false;
		if (!unpack_uastc(unpacked_src_blk, &block_pixels[0][0], unpack_srgb))
			return false;

		basist::encode_bc4(pBC4_block0, &block_pixels[0][0].c[chan0], sizeof(color32));
		basist::encode_bc4(pBC4_block1, &block_pixels[0][0].c[chan1], sizeof(color32));

		return true;
	}